

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLExportTest_writeValueTypeTest_Test::OpenDDLExportTest_writeValueTypeTest_Test
          (OpenDDLExportTest_writeValueTypeTest_Test *this)

{
  OpenDDLExportTest::OpenDDLExportTest(&this->super_OpenDDLExportTest);
  (this->super_OpenDDLExportTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_0017ad68;
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writeValueTypeTest) {
    OpenDDLExportMock myExporter;
    bool ok(true);
    std::string statement;
    ok = myExporter.writeValueTypeTester(Value::ValueType::ddl_types_max, 1, statement);
    EXPECT_FALSE(ok);
    EXPECT_TRUE(statement.empty());

    Value *v_int32 = ValueAllocator::allocPrimData(Value::ValueType::ddl_int32);
    ok = myExporter.writeValueTypeTester(v_int32->m_type, 1, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("int32", statement);
    statement.clear();
    delete v_int32;

    Value *v_int32_array = ValueAllocator::allocPrimData(Value::ValueType::ddl_int32);
    ok = myExporter.writeValueTypeTester(v_int32_array->m_type, 10, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("int32[10]", statement);
    delete v_int32_array;
}